

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue js_typed_array_from(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  int64_t iVar1;
  void *pvVar2;
  JSShape *sh;
  JSValue new_target;
  JSValue ctor;
  JSValueUnion JVar3;
  JSValue method;
  int iVar4;
  JSValueUnion JVar5;
  JSValueUnion JVar6;
  uint uVar7;
  ulong uVar8;
  int64_t iVar9;
  int64_t iVar10;
  ulong idx;
  ulong uVar11;
  bool bVar12;
  JSValue enum_obj;
  JSValue func_obj;
  JSValue enum_obj_00;
  JSValue v;
  JSValue v_00;
  JSValue JVar13;
  JSValue JVar14;
  JSValue v_01;
  JSValue JVar15;
  JSValue JVar16;
  JSValue prop;
  JSValue this_obj;
  int done;
  int64_t len;
  undefined4 uVar17;
  undefined4 in_stack_fffffffffffffeec;
  undefined4 uVar18;
  BOOL *in_stack_fffffffffffffef0;
  BOOL *pdone;
  JSValueUnion local_d8;
  ulong local_c0;
  int local_b4;
  int64_t local_b0;
  void *local_a8;
  JSValueUnion local_a0;
  JSValueUnion local_98;
  undefined8 local_90;
  int32_t local_88;
  undefined4 uStack_84;
  int64_t local_80;
  JSValueUnion local_78;
  int64_t local_70;
  JSValueUnion local_68;
  BOOL *pBStack_60;
  ulong local_58;
  undefined8 local_50;
  int64_t local_48;
  ulong local_40;
  ulong local_38;
  
  local_98 = (JSValueUnion)this_val.tag;
  local_a0 = this_val.u;
  JVar6 = *(JSValueUnion *)&(argv->u).int32;
  iVar1 = argv->tag;
  JVar15 = *argv;
  JVar14 = *argv;
  JVar13 = *argv;
  uVar8 = 0;
  local_88 = 0;
  local_80 = 3;
  local_78.int32 = 0;
  local_70 = 3;
  local_90 = 1;
  if (argc < 2) {
    iVar10 = 3;
    local_c0 = 0;
    iVar9 = 3;
    local_a8 = (void *)0x0;
    local_40 = 0;
LAB_001709e6:
    uVar17 = 0;
    JVar13 = JS_GetPropertyInternal(ctx,JVar13,0xc6,JVar14,0);
    JVar5 = JVar13.u;
    uVar7 = (uint)JVar13.tag;
    if (uVar7 == 3) {
      local_48 = iVar10;
      JVar13 = JS_ToObject(ctx,JVar15);
      if ((int)JVar13.tag != 6) {
LAB_00170a4d:
        iVar4 = js_get_length64(ctx,(int64_t *)&local_38,JVar13);
        if (-1 < iVar4) {
          bVar12 = (long)(int)local_38 == local_38;
          local_68.float64 = (double)(long)local_38;
          if (bVar12) {
            local_68.ptr = (void *)(local_38 & 0xffffffff);
          }
          pBStack_60 = (BOOL *)7;
          if (bVar12) {
            pBStack_60 = (BOOL *)0;
          }
          ctor.tag = (int64_t)local_98.ptr;
          ctor.u.float64 = local_a0.float64;
          local_b0 = iVar9;
          JVar14 = js_typed_array_create(ctx,ctor,1,(JSValue *)&local_68);
          uVar11 = (ulong)JVar14.u.ptr >> 0x20;
          if ((int)JVar14.tag != 6) {
            if (0 < (long)local_38) {
              local_98.ptr = (void *)((ulong)local_a8 & 0xffffffff | local_40 << 0x20);
              idx = 0;
              do {
                v_01 = JS_GetPropertyInt64(ctx,JVar13,idx);
                JVar6 = v_01.u;
                if ((uint)v_01.tag == 6) goto LAB_00170ed7;
                if ((char)local_90 == '\0') {
                  local_58 = idx & 0xffffffff;
                  local_50 = 0;
                  new_target.tag = 3;
                  new_target.u.float64 = local_d8.float64 & 0xffffffff00000000;
                  func_obj.tag = local_b0;
                  func_obj.u.ptr = local_98.ptr;
                  this_obj.tag = local_48;
                  this_obj.u.ptr = (void *)(local_c0 | uVar8);
                  _local_68 = v_01;
                  JVar15 = JS_CallInternal(ctx,func_obj,this_obj,new_target,2,(JSValue *)&local_68,2
                                          );
                  JVar5 = (JSValueUnion)JVar15.tag;
                  if ((0xfffffff4 < (uint)v_01.tag) &&
                     (iVar4 = *JVar6.ptr, *(int *)JVar6.ptr = iVar4 + -1, iVar4 < 2)) {
                    local_a0 = JVar5;
                    __JS_FreeValueRT(ctx->rt,v_01);
                    JVar5 = local_a0;
                  }
                  v_01.tag = (int64_t)JVar5.ptr;
                  v_01.u.float64 = JVar15.u.float64;
                  local_d8 = JVar6;
                  if (JVar5.int32 == 6) goto LAB_00170ed7;
                }
                iVar4 = JS_SetPropertyInt64(ctx,JVar14,idx,v_01);
                if (iVar4 < 0) goto LAB_00170ed7;
                idx = idx + 1;
              } while (local_38 != idx);
            }
            goto LAB_00170f17;
          }
          goto LAB_00170ed7;
        }
      }
      goto LAB_00170b78;
    }
    if (uVar7 == 6) {
      JVar13 = (JSValue)(ZEXT816(3) << 0x40);
      goto LAB_00170b78;
    }
    local_68.ptr = JVar5.ptr;
    local_48 = iVar10;
    if ((0xfffffff4 < uVar7) && (iVar4 = *JVar5.ptr, *(int *)JVar5.ptr = iVar4 + -1, iVar4 < 2)) {
      __JS_FreeValueRT(ctx->rt,JVar13);
    }
    sh = ctx->array_shape;
    (sh->header).ref_count = (sh->header).ref_count + 1;
    JVar13 = JS_NewObjectFromShape(ctx,sh,2);
    if ((int)JVar13.tag != 6) {
      local_68.float64 = JVar6.float64;
      if (0xfffffff4 < (uint)iVar1) {
        *(int *)JVar6.ptr = *JVar6.ptr + 1;
      }
      local_88 = JVar6.int32;
      uStack_84 = JVar6._4_4_;
      local_b0 = iVar9;
      local_80 = iVar1;
      iVar4 = js_for_of_start(ctx,(JSValue *)&local_78,0);
      iVar1 = local_80;
      if (iVar4 == 0) {
        JVar6._4_4_ = uStack_84;
        JVar6.int32 = local_88;
        JVar14.u._4_4_ = uStack_84;
        JVar14.u.int32 = local_88;
        JVar14.tag = local_80;
        method.u._4_4_ = local_78._4_4_;
        method.u.int32 = local_78.int32;
        method.tag = local_70;
        JVar15.u._4_4_ = local_78._4_4_;
        JVar15.u.int32 = local_78.int32;
        JVar15.tag = local_70;
        JVar14 = JS_IteratorNext(ctx,JVar14,JVar15,(int)&local_b4,
                                 (JSValue *)CONCAT44(in_stack_fffffffffffffeec,uVar17),
                                 in_stack_fffffffffffffef0);
        if ((int)JVar14.tag != 6) {
          uVar11 = 0;
          do {
            iVar9 = local_b0;
            if (local_b4 != 0) goto LAB_00170a4d;
            JVar5.float64 = (double)(long)uVar11;
            if (uVar11 >> 0x1f == 0) {
              iVar9 = 0;
              JVar5.ptr = (void *)(uVar11 & 0xffffffff);
            }
            else {
              iVar9 = 7;
            }
            pBStack_60 = (BOOL *)JVar14.tag;
            uVar17 = JVar14.u._0_4_;
            uVar18 = JVar14.u._4_4_;
            prop.tag = iVar9;
            prop.u.ptr = JVar5.ptr;
            pdone = pBStack_60;
            _local_68 = JVar14;
            iVar4 = JS_DefinePropertyValueValue(ctx,JVar13,prop,JVar14,0x4007);
            if (iVar4 < 0) break;
            uVar11 = uVar11 + 1;
            enum_obj.tag = iVar1;
            enum_obj.u.ptr = JVar6.ptr;
            JVar14 = JS_IteratorNext(ctx,enum_obj,method,(int)&local_b4,
                                     (JSValue *)CONCAT44(uVar18,uVar17),pdone);
          } while ((int)JVar14.tag != 6);
        }
        if ((int)iVar1 == 3) {
          JVar14 = (JSValue)(ZEXT816(3) << 0x40);
          uVar11 = 0;
        }
        else {
          enum_obj_00.tag = iVar1;
          enum_obj_00.u.ptr = JVar6.ptr;
          JS_IteratorClose(ctx,enum_obj_00,1);
          JVar14 = (JSValue)(ZEXT816(3) << 0x40);
          uVar11 = 0;
        }
        goto LAB_00170ed7;
      }
    }
    uVar11 = 0;
    JVar14 = (JSValue)(ZEXT816(3) << 0x40);
  }
  else {
    pvVar2 = argv[1].u.ptr;
    iVar9 = argv[1].tag;
    local_40 = (ulong)pvVar2 >> 0x20;
    if ((int)iVar9 == 3) {
LAB_001709b1:
      uVar8 = 0;
      iVar10 = 3;
      local_c0 = 0;
      local_a8 = pvVar2;
      goto LAB_001709e6;
    }
    iVar4 = check_function(ctx,argv[1]);
    if (iVar4 == 0) {
      if (argc != 2) {
        iVar10 = argv[2].tag;
        local_c0 = (ulong)argv[2].u.ptr & 0xffffffff00000000;
        uVar8 = (ulong)argv[2].u.ptr & 0xffffffff;
        local_90 = 0;
        local_a8 = pvVar2;
        goto LAB_001709e6;
      }
      local_90 = 0;
      goto LAB_001709b1;
    }
    JVar13 = (JSValue)(ZEXT816(3) << 0x40);
LAB_00170b78:
    uVar11 = 0;
    JVar14 = (JSValue)(ZEXT816(3) << 0x40);
  }
LAB_00170ed7:
  JVar6.ptr = (void *)((ulong)JVar14.u.ptr & 0xffffffff | uVar11 << 0x20);
  if ((0xfffffff4 < (uint)JVar14.tag) &&
     (iVar4 = *JVar6.ptr, *(int *)JVar6.ptr = iVar4 + -1, iVar4 < 2)) {
    v.tag = JVar14.tag;
    v.u.ptr = JVar6.ptr;
    __JS_FreeValueRT(ctx->rt,v);
  }
  JVar14 = (JSValue)(ZEXT816(6) << 0x40);
  uVar11 = 0;
LAB_00170f17:
  if ((0xfffffff4 < (uint)JVar13.tag) &&
     (iVar4 = *JVar13.u.ptr, *(int *)JVar13.u.ptr = iVar4 + -1, iVar4 < 2)) {
    __JS_FreeValueRT(ctx->rt,JVar13);
  }
  JVar5._4_4_ = uStack_84;
  JVar5.int32 = local_88;
  if ((0xfffffff4 < (uint)local_80) &&
     (iVar4 = *JVar5.ptr, *(int *)JVar5.ptr = iVar4 + -1, iVar4 < 2)) {
    JVar13.tag = local_80;
    JVar13.u.ptr = JVar5.ptr;
    __JS_FreeValueRT(ctx->rt,JVar13);
  }
  JVar3._4_4_ = local_78._4_4_;
  JVar3.int32 = local_78.int32;
  if ((0xfffffff4 < (uint)local_70) &&
     (iVar4 = *JVar3.ptr, *(int *)JVar3.ptr = iVar4 + -1, iVar4 < 2)) {
    v_00.tag = local_70;
    v_00.u.ptr = JVar3.ptr;
    __JS_FreeValueRT(ctx->rt,v_00);
  }
  JVar16.u.ptr = (void *)((ulong)JVar14.u.ptr & 0xffffffff | uVar11 << 0x20);
  JVar16.tag = JVar14.tag;
  return JVar16;
}

Assistant:

static JSValue js_typed_array_from(JSContext *ctx, JSValueConst this_val,
                                   int argc, JSValueConst *argv)
{
    // from(items, mapfn = void 0, this_arg = void 0)
    JSValueConst items = argv[0], mapfn, this_arg;
    JSValueConst args[2];
    JSValue stack[2];
    JSValue iter, arr, r, v, v2;
    int64_t k, len;
    int done, mapping;

    mapping = FALSE;
    mapfn = JS_UNDEFINED;
    this_arg = JS_UNDEFINED;
    r = JS_UNDEFINED;
    arr = JS_UNDEFINED;
    stack[0] = JS_UNDEFINED;
    stack[1] = JS_UNDEFINED;

    if (argc > 1) {
        mapfn = argv[1];
        if (!JS_IsUndefined(mapfn)) {
            if (check_function(ctx, mapfn))
                goto exception;
            mapping = 1;
            if (argc > 2)
                this_arg = argv[2];
        }
    }
    iter = JS_GetProperty(ctx, items, JS_ATOM_Symbol_iterator);
    if (JS_IsException(iter))
        goto exception;
    if (!JS_IsUndefined(iter)) {
        JS_FreeValue(ctx, iter);
        arr = JS_NewArray(ctx);
        if (JS_IsException(arr))
            goto exception;
        stack[0] = JS_DupValue(ctx, items);
        if (js_for_of_start(ctx, &stack[1], FALSE))
            goto exception;
        for (k = 0;; k++) {
            v = JS_IteratorNext(ctx, stack[0], stack[1], 0, NULL, &done);
            if (JS_IsException(v))
                goto exception_close;
            if (done)
                break;
            if (JS_DefinePropertyValueInt64(ctx, arr, k, v, JS_PROP_C_W_E | JS_PROP_THROW) < 0)
                goto exception_close;
        }
    } else {
        arr = JS_ToObject(ctx, items);
        if (JS_IsException(arr))
            goto exception;
    }
    if (js_get_length64(ctx, &len, arr) < 0)
        goto exception;
    v = JS_NewInt64(ctx, len);
    args[0] = v;
    r = js_typed_array_create(ctx, this_val, 1, args);
    JS_FreeValue(ctx, v);
    if (JS_IsException(r))
        goto exception;
    for(k = 0; k < len; k++) {
        v = JS_GetPropertyInt64(ctx, arr, k);
        if (JS_IsException(v))
            goto exception;
        if (mapping) {
            args[0] = v;
            args[1] = JS_NewInt32(ctx, k);
            v2 = JS_Call(ctx, mapfn, this_arg, 2, args);
            JS_FreeValue(ctx, v);
            v = v2;
            if (JS_IsException(v))
                goto exception;
        }
        if (JS_SetPropertyInt64(ctx, r, k, v) < 0)
            goto exception;
    }
    goto done;

 exception_close:
    if (!JS_IsUndefined(stack[0]))
        JS_IteratorClose(ctx, stack[0], TRUE);
 exception:
    JS_FreeValue(ctx, r);
    r = JS_EXCEPTION;
 done:
    JS_FreeValue(ctx, arr);
    JS_FreeValue(ctx, stack[0]);
    JS_FreeValue(ctx, stack[1]);
    return r;
}